

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
          (Printer *this,char *begin_varname,char *end_varname,FieldDescriptor *descriptor)

{
  undefined1 auStack_48 [8];
  vector<int,_std::allocator<int>_> path;
  
  if (*(long *)(this + 0x98) != 0) {
    auStack_48 = (undefined1  [8])0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    google::protobuf::FieldDescriptor::GetLocationPath((vector *)descriptor);
    google::protobuf::io::Printer::Annotate
              ((char *)this,begin_varname,(string *)end_varname,
               (vector *)**(undefined8 **)(descriptor + 0x28));
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)auStack_48);
  }
  return;
}

Assistant:

void Annotate(const char* begin_varname, const char* end_varname,
                const SomeDescriptor* descriptor) {
    if (annotation_collector_ == NULL) {
      // Annotations aren't turned on for this Printer, so don't pay the cost
      // of building the location path.
      return;
    }
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    Annotate(begin_varname, end_varname, descriptor->file()->name(), path);
  }